

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::SweepWeakReference(Recycler *this)

{
  uint uVar1;
  RecyclerWeakReferenceBase **ppRVar2;
  void *address;
  HeapAllocator *this_00;
  code *pcVar3;
  SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *buffer;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  HeapBlock *pHVar10;
  byte bVar11;
  ulong uVar12;
  Type TVar13;
  uint uVar14;
  Type pRVar15;
  RecyclerWeakReferenceBase *pRVar16;
  Type *ppRVar17;
  undefined1 local_60 [8];
  EditingIterator edIt;
  
  if ((this->weakReferenceMap).size == 0) {
    bVar11 = 0;
    uVar14 = 0;
    uVar1 = 0;
  }
  else {
    bVar11 = 0;
    uVar12 = 0;
    uVar1 = 0;
    uVar14 = 0;
    do {
      ppRVar2 = (this->weakReferenceMap).buckets;
      pRVar16 = ppRVar2[uVar12];
      if (pRVar16 != (RecyclerWeakReferenceBase *)0x0) {
        ppRVar17 = ppRVar2 + uVar12;
        do {
          iVar6 = (*pRVar16->weakRefHeapBlock->_vptr_HeapBlock[0xb])
                            (pRVar16->weakRefHeapBlock,pRVar16);
          if ((char)iVar6 == '\0') {
LAB_0071b224:
            *ppRVar17 = pRVar16->next;
            uVar14 = uVar14 + 1;
            bVar11 = 1;
          }
          else {
            iVar6 = (*pRVar16->strongRefHeapBlock->_vptr_HeapBlock[0xb])
                              (pRVar16->strongRefHeapBlock,pRVar16->strongRef);
            if ((char)iVar6 == '\0') {
              pRVar16->strongRef = (Type)0x0;
              pRVar16->strongRefHeapBlock =
                   &CollectedRecyclerWeakRefHeapBlock::Instance.super_HeapBlock;
              goto LAB_0071b224;
            }
            ppRVar17 = &pRVar16->next;
            uVar1 = uVar1 + 1;
          }
          pRVar16 = *ppRVar17;
        } while (pRVar16 != (Type)0x0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->weakReferenceMap).size);
  }
  if ((this->weakReferenceMap).count < uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x107,"(removed <= count)","removed <= count");
    if (!bVar4) goto LAB_0071b4ca;
    *puVar8 = 0;
  }
  uVar7 = (this->weakReferenceMap).count - uVar14;
  (this->weakReferenceMap).count = uVar7;
  if (uVar1 != uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x10b,"(countedEntries == count)","countedEntries == count");
    if (!bVar4) {
LAB_0071b4ca:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  local_60 = (undefined1  [8])&this->weakReferenceRegionList;
  edIt.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  edIt.super_EditingIterator.super_Iterator.list =
       (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)local_60;
  bVar4 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
          EditingIterator::Next((EditingIterator *)local_60);
  if (bVar4) {
    edIt.super_EditingIterator.last = (NodeBase *)&this->heapBlockMap;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pTVar9 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
               Iterator::Data((Iterator *)local_60);
      pRVar15 = pTVar9->ptr;
      TVar13 = pTVar9->count;
      iVar6 = (*pTVar9->arrayHeapBlock->_vptr_HeapBlock[0xb])(pTVar9->arrayHeapBlock,pRVar15);
      buffer = edIt.super_EditingIterator.super_Iterator.list;
      if ((char)iVar6 == '\0') {
        this_00 = (HeapAllocator *)
                  (((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>
                     *)((long)local_60 + 0x10))->super_SListNodeBase<Memory::HeapAllocator>).next;
        SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
        EditingIterator::UnlinkCurrentNode((EditingIterator *)local_60);
        HeapAllocator::Free(this_00,buffer,0x20);
        bVar11 = 1;
      }
      else if (TVar13 != 0) {
        pRVar15 = pRVar15 + 8;
        do {
          address = *(void **)(pRVar15 + -8);
          if (address != (void *)0x0) {
            uVar12 = *(ulong *)pRVar15;
            if ((uVar12 & 1) == 0) {
              if (uVar12 == 0) {
                if (((ulong)address & 0xf) == 0 && (void *)0xffff < address) {
                  pHVar10 = HeapBlockMap64::GetHeapBlock
                                      ((HeapBlockMap64 *)edIt.super_EditingIterator.last,address);
                }
                else {
                  pHVar10 = (HeapBlock *)0x0;
                }
                if (pHVar10 == (HeapBlock *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar8 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                                     ,0xcb0,"(false)",
                                     "WeakReferenceRegionItems should only contain recycler references"
                                    );
                  if (!bVar4) goto LAB_0071b4ca;
                  *puVar8 = 0;
                }
                else {
                  *(HeapBlock **)pRVar15 = pHVar10;
                }
                if (pHVar10 == (HeapBlock *)0x0) goto LAB_0071b469;
              }
              cVar5 = (**(code **)(**(long **)pRVar15 + 0x58))
                                (*(long **)pRVar15,*(ulong *)(pRVar15 + -8));
              if (cVar5 == '\0') {
                *(ulong *)(pRVar15 + -8) = 0;
                *(ulong *)pRVar15 = 0;
                bVar11 = 1;
              }
            }
            else {
              *(ulong *)pRVar15 = uVar12 & 0xfffffffffffffffe;
            }
          }
LAB_0071b469:
          pRVar15 = pRVar15 + 0x10;
          TVar13 = TVar13 - 1;
        } while (TVar13 != 0);
      }
      bVar4 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_60);
    } while (bVar4);
  }
  this->weakReferenceCleanupId = this->weakReferenceCleanupId + (uint)bVar11;
  return;
}

Assistant:

void
Recycler::SweepWeakReference()
{
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::SweepWeakPhase);
    GCETW(GC_SWEEP_WEAKREF_START, (this));

    // REVIEW: Clean up the weak reference map concurrently?
    bool hasCleanup = false;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint scannedCount = weakReferenceMap.Count();
#endif

    weakReferenceMap.Map([&hasCleanup](RecyclerWeakReferenceBase * weakRef) -> bool
    {
        if (!weakRef->weakRefHeapBlock->TestObjectMarkedBit(weakRef))
        {
            hasCleanup = true;

            // Remove
            return false;
        }

        if (!weakRef->strongRefHeapBlock->TestObjectMarkedBit(weakRef->strongRef))
        {
            hasCleanup = true;
            weakRef->strongRef = nullptr;

            // Put in a dummy heap block so that we can still do the isPendingConcurrentSweep check first.
            weakRef->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance;

            // Remove
            return false;
        }

        return true;
    });

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint regionScannedCount = 0;
    uint regionClearedCount = 0;
#endif

#if ENABLE_WEAK_REFERENCE_REGIONS

    auto edIt = this->weakReferenceRegionList.GetEditingIterator();
    while (edIt.Next())
    {
        RecyclerWeakReferenceRegion region = edIt.Data();
        // We want to see if user code has any reference to the region, if not, we can free the whole thing
        if (!region.GetHeapBlock()->TestObjectMarkedBit(region.GetPtr()))
        {
            edIt.RemoveCurrent();
            hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
            regionClearedCount += (uint)region.GetCount();
#endif
            continue;
        }

        // The region is referenced, clean up any stale weak references
        RecyclerWeakReferenceRegionItem<void*>* refs = region.GetPtr();
#if defined(GCETW) && defined(ENABLE_JS_ETW)
        regionScannedCount += (uint)region.GetCount();
#endif
        for (size_t i = 0; i < region.GetCount(); ++i)
        {
            RecyclerWeakReferenceRegionItem<void*> &ref = refs[i];
            if (ref.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)ref.heapBlock & 0x1) == 0x1)
            {
                // Background thread marked this ref. Unmark it, and keep it
                ref.heapBlock = (HeapBlock*)((uintptr_t)ref.heapBlock & ~0x1);
                continue;
            }

            if (ref.heapBlock == nullptr)
            {
                HeapBlock* block = this->FindHeapBlock(ref.ptr);
                if (block == nullptr)
                {
                    // This is not a real reference
                    AssertMsg(false, "WeakReferenceRegionItems should only contain recycler references");
                    continue;
                }
                else
                {
                    ref.heapBlock = block;
                }
            }

            if (!ref.heapBlock->TestObjectMarkedBit(ref))
            {
                ref.ptr = nullptr;
                ref.heapBlock = nullptr;
                hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
                regionClearedCount++;
#endif
            }
        }
    }
#endif

    this->weakReferenceCleanupId += hasCleanup;

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    const uint keptCount = weakReferenceMap.Count();
    GCETW(GC_SWEEP_WEAKREF_STOP_EX, (this, scannedCount, (scannedCount - keptCount), regionScannedCount, regionClearedCount));
#endif

    RECYCLER_PROFILE_EXEC_END(this, Js::SweepWeakPhase);
}